

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::~IfcTendon(IfcTendon *this)

{
  IfcElement *this_00;
  void *pvVar1;
  long lVar2;
  undefined1 *puVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            ((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + lVar2);
  pvVar1 = &this->field_0x1b0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x988c60;
  *(undefined8 *)((long)pvVar1 + 0x70) = 0x988dc8;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x988c88;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x988cb0;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x988cd8;
  *(undefined8 *)((long)pvVar1 + -0xb0) = 0x988d00;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x988d28;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x988d50;
  *(undefined8 *)((long)pvVar1 + -0x58) = 0x988d78;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x988da0;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject = 0x989030;
  *(undefined8 *)&this_00[1].super_IfcProduct.super_IfcObject.field_0xd0 = 0x989170;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0x88 = 0x989058;
  (this_00->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x989080;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0xd0 = 0x9890a8;
  *(undefined8 *)&(this_00->super_IfcProduct).field_0x100 = 0x9890d0;
  *(undefined8 *)&this_00->field_0x138 = 0x9890f8;
  *(undefined8 *)&this_00->field_0x148 = 0x989120;
  *(undefined8 *)&this_00[1].super_IfcProduct.super_IfcObject.field_0x8 = 0x989148;
  puVar3 = *(undefined1 **)&this_00[1].super_IfcProduct.super_IfcObject.field_0x18;
  if (puVar3 != &this_00[1].super_IfcProduct.super_IfcObject.field_0x28) {
    operator_delete(puVar3);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__00988df8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}